

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

void __thiscall Json::StyledWriter::writeCommentBeforeValue(StyledWriter *this,Value *root)

{
  string *psVar1;
  _Alloc_hider _Var2;
  string local_40;
  
  if ((root->comments_ != (CommentInfo *)0x0) && (root->comments_->comment_ != (char *)0x0)) {
    psVar1 = &this->document_;
    std::__cxx11::string::append((char *)psVar1);
    writeIndent(this);
    Value::getComment_abi_cxx11_(&local_40,root,commentBefore);
    _Var2._M_p = local_40._M_dataplus._M_p;
    if (local_40._M_string_length != 0) {
      do {
        std::__cxx11::string::push_back((char)psVar1);
        if (((*_Var2._M_p == '\n') &&
            (_Var2._M_p != local_40._M_dataplus._M_p + local_40._M_string_length)) &&
           (_Var2._M_p[1] == '/')) {
          writeIndent(this);
        }
        _Var2._M_p = _Var2._M_p + 1;
      } while (_Var2._M_p != local_40._M_dataplus._M_p + local_40._M_string_length);
    }
    std::__cxx11::string::append((char *)psVar1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

bool Value::hasComment(CommentPlacement placement) const {
  return comments_ != 0 && comments_[placement].comment_ != 0;
}